

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

char __thiscall World::TileToCharacter(World *this,Tiles *tile)

{
  TileType TVar1;
  
  TVar1 = Tiles::getData(tile);
  return (char)(0x7e595e232c53 >> ((char)TVar1 * '\b' & 0x3fU));
}

Assistant:

char World::TileToCharacter(Tiles tile)
{
	TileType tileData = tile.getData();

	switch(tileData)
	{
		case WATER:
			return 'S';
		case GRASS:
			return ',';
		case PATH:
			return '#';
		case MOUNTAIN:
			return '^';
		case FOREST:
			return 'Y';
		case EMPTY:
			return '~';
	}

}